

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  uint8_t *puVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint8_t uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  size_t *local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong auStack_a8 [4];
  long local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ContextLut local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_108 = *(ulong *)dist_cache;
  local_80 = position + num_bytes;
  local_40 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    local_40 = position;
  }
  local_88 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_88 = 0x40;
  }
  if (local_80 <= position + 8) {
    local_e8 = last_insert_len;
LAB_00102f52:
    *(ulong *)dist_cache = (local_108 + local_80) - position;
    *(long *)commands = *(long *)commands + ((long)local_e8 - (long)last_insert_len >> 4);
    return;
  }
  uVar8 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_68 = literal_context_lut;
  local_48 = *(long *)(literal_context_lut + 0x10);
  local_e0 = local_88 + position;
  lVar2 = *(long *)&(params->hasher).num_last_distances_to_check;
  local_78 = ringbuffer_mask & 0xffffffff;
  local_58 = (ulong)(uint)((int)local_88 * 4);
  auStack_a8[3] = local_80 - 7;
  local_50 = (position - 1) + num_bytes;
  local_e8 = last_insert_len;
  uVar7 = local_80;
  sVar21 = position;
LAB_00102493:
  uVar7 = uVar7 - sVar21;
  uVar18 = uVar8;
  if (sVar21 < uVar8) {
    uVar18 = sVar21;
  }
  uVar23 = sVar21 & ringbuffer_mask;
  puVar1 = ringbuffer + uVar23;
  uVar20 = ringbuffer[uVar23];
  local_100 = (ulong)*(int *)&(hasher->common).extra;
  local_78._0_4_ = (uint)ringbuffer_mask;
  if ((sVar21 - local_100 < sVar21) &&
     (uVar13 = (ulong)((uint)(sVar21 - local_100) & (uint)local_78), uVar20 == ringbuffer[uVar13]))
  {
    if (7 < uVar7) {
      uVar15 = uVar7 & 0xfffffffffffffff8;
      puVar12 = ringbuffer + uVar15 + uVar23;
      lVar16 = 0;
      uVar25 = 0;
LAB_0010250e:
      if (*(ulong *)(puVar1 + uVar25 * 8) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar13))
      goto code_r0x0010251f;
      uVar15 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar13) ^ *(ulong *)(puVar1 + uVar25 * 8);
      uVar13 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar25 = (uVar13 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_00102b50;
    }
    uVar15 = 0;
    puVar12 = puVar1;
LAB_00102f0f:
    uVar19 = uVar7 & 7;
    uVar25 = uVar15;
    if (uVar19 != 0) {
      uVar24 = uVar15 | uVar19;
      do {
        uVar25 = uVar15;
        if (ringbuffer[uVar15 + uVar13] != *puVar12) break;
        puVar12 = puVar12 + 1;
        uVar15 = uVar15 + 1;
        uVar19 = uVar19 - 1;
        uVar25 = uVar24;
      } while (uVar19 != 0);
    }
LAB_00102b50:
    if ((uVar25 < 4) || (uVar13 = uVar25 * 0x87 + 0x78f, uVar13 < 0x7e5)) goto LAB_00102547;
    uVar20 = puVar1[uVar25];
  }
  else {
LAB_00102547:
    uVar13 = 0x7e4;
    local_100 = 0;
    uVar25 = 0;
  }
  lVar16 = *(long *)(ringbuffer + uVar23);
  lVar17 = 0;
  do {
    *(ulong *)((long)auStack_a8 + lVar17) =
         (ulong)((uint)(ushort)((ulong)(lVar16 * -0x42e1ca5843000000) >> 0x30) + (int)lVar17 &
                0xffff);
    lVar17 = lVar17 + 8;
  } while (lVar17 == 8);
  uVar15 = (ulong)((uint)uVar7 & 7);
  lVar16 = 0;
  do {
    uVar9 = *(uint *)(lVar2 + auStack_a8[lVar16] * 4);
    uVar11 = (uint)local_78 & uVar9;
    if (((uVar20 == ringbuffer[uVar25 + uVar11]) && (sVar21 != uVar9)) &&
       (uVar19 = sVar21 - uVar9, uVar19 <= uVar18)) {
      if (7 < uVar7) {
        lVar17 = 0;
        uVar24 = 0;
LAB_00102605:
        if (*(ulong *)(puVar1 + uVar24 * 8) == *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar11))
        goto code_r0x00102612;
        uVar22 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar11) ^
                 *(ulong *)(puVar1 + uVar24 * 8);
        uVar24 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_0010264b;
      }
      uVar22 = 0;
      puVar12 = puVar1;
LAB_0010269c:
      uVar24 = uVar22;
      if (uVar15 != 0) {
        uVar26 = uVar15 | uVar22;
        uVar27 = uVar15;
        do {
          uVar24 = uVar22;
          if (ringbuffer[uVar22 + uVar11] != *puVar12) break;
          puVar12 = puVar12 + 1;
          uVar22 = uVar22 + 1;
          uVar27 = uVar27 - 1;
          uVar24 = uVar26;
        } while (uVar27 != 0);
      }
LAB_0010264b:
      if (3 < uVar24) {
        iVar10 = 0x1f;
        if ((uint)uVar19 != 0) {
          for (; (uint)uVar19 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        uVar22 = (ulong)(iVar10 * -0x1e + 0x780) + uVar24 * 0x87;
        if (uVar13 < uVar22) {
          uVar20 = puVar1[uVar24];
          uVar25 = uVar24;
          uVar13 = uVar22;
          local_100 = uVar19;
        }
      }
    }
    bVar28 = lVar16 == 0;
    lVar16 = lVar16 + 1;
  } while (bVar28);
  *(uint *)(lVar2 + *(long *)((long)auStack_a8 + (ulong)((uint)sVar21 & 8)) * 4) = (uint)sVar21;
  if (0x7e4 < uVar13) {
    local_60 = (ulong)*(int *)&(hasher->common).extra;
    uVar18 = local_50 - sVar21;
    iVar10 = 0;
LAB_00102708:
    local_70 = uVar18 >> 3;
    uVar7 = uVar7 - 1;
    uVar23 = uVar25 - 1;
    if (uVar7 <= uVar25 - 1) {
      uVar23 = uVar7;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar23 = 0;
    }
    uVar15 = sVar21 + 1;
    uVar19 = uVar8;
    if (uVar15 < uVar8) {
      uVar19 = uVar15;
    }
    puVar1 = ringbuffer + (uVar15 & ringbuffer_mask);
    uVar20 = puVar1[uVar23];
    uVar24 = 0x7e4;
    if ((uVar15 - local_60 < uVar15) &&
       (uVar9 = (uint)(uVar15 - local_60) & (uint)local_78, uVar20 == ringbuffer[uVar23 + uVar9])) {
      if (7 < uVar7) {
        lVar16 = 0;
        uVar22 = 0;
LAB_0010279e:
        if (*(ulong *)(puVar1 + uVar22 * 8) == *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar9))
        goto code_r0x001027ac;
        uVar27 = *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar9) ^
                 *(ulong *)(puVar1 + uVar22 * 8);
        uVar22 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        local_d0 = (uVar22 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_001027e2;
      }
      local_d0 = 0;
      puVar12 = puVar1;
      goto LAB_001029ff;
    }
    goto LAB_00102816;
  }
  local_108 = local_108 + 1;
  position = sVar21 + 1;
  if ((num_literals == (size_t *)0x0) && (local_e0 < position)) {
    if (local_58 + local_e0 < position) {
      uVar7 = sVar21 + 0x11;
      if (auStack_a8[3] <= sVar21 + 0x11) {
        uVar7 = auStack_a8[3];
      }
      for (; position < uVar7; position = position + 4) {
        *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_108 = local_108 + 4;
      }
    }
    else {
      uVar7 = sVar21 + 9;
      if (auStack_a8[3] <= sVar21 + 9) {
        uVar7 = auStack_a8[3];
      }
      for (; position < uVar7; position = position + 2) {
        *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_108 = local_108 + 2;
      }
    }
  }
  goto LAB_00102ebb;
code_r0x0010251f:
  uVar25 = uVar25 + 1;
  lVar16 = lVar16 + -8;
  if (uVar7 >> 3 == uVar25) goto LAB_00102f0f;
  goto LAB_0010250e;
code_r0x00102612:
  uVar24 = uVar24 + 1;
  lVar17 = lVar17 + -8;
  uVar22 = uVar7 & 0xfffffffffffffff8;
  puVar12 = ringbuffer + (uVar7 & 0xfffffffffffffff8) + uVar23;
  if (uVar7 >> 3 == uVar24) goto LAB_0010269c;
  goto LAB_00102605;
code_r0x001027ac:
  uVar22 = uVar22 + 1;
  lVar16 = lVar16 + -8;
  if (local_70 == uVar22) goto code_r0x001027ba;
  goto LAB_0010279e;
code_r0x001027ba:
  local_d0 = -lVar16;
  puVar12 = puVar1 + -lVar16;
LAB_001029ff:
  uVar22 = uVar7 & 7;
  for (; (uVar22 != 0 && (ringbuffer[local_d0 + uVar9] == *puVar12)); local_d0 = local_d0 + 1) {
    puVar12 = puVar12 + 1;
    uVar22 = uVar22 - 1;
  }
LAB_001027e2:
  if ((local_d0 < 4) || (uVar22 = local_d0 * 0x87 + 0x78f, uVar22 < 0x7e5)) {
LAB_00102816:
    local_f8 = 0;
    local_d0 = 0;
  }
  else {
    uVar20 = puVar1[local_d0];
    uVar23 = local_d0;
    uVar24 = uVar22;
    local_f8 = local_60;
  }
  lVar16 = *(long *)(ringbuffer + (uVar15 & ringbuffer_mask));
  lVar17 = 0;
  do {
    *(ulong *)((long)auStack_a8 + lVar17) =
         (ulong)((uint)(ushort)((ulong)(lVar16 * -0x42e1ca5843000000) >> 0x30) + (int)lVar17 &
                0xffff);
    lVar17 = lVar17 + 8;
  } while (lVar17 == 8);
  local_38 = (ulong)((uint)uVar7 & 7);
  lVar16 = 0;
LAB_00102876:
  uVar9 = *(uint *)(lVar2 + auStack_a8[lVar16] * 4);
  uVar11 = (uint)local_78 & uVar9;
  if (((uVar20 == ringbuffer[uVar23 + uVar11]) && (uVar15 != uVar9)) &&
     (uVar22 = uVar15 - uVar9, uVar22 <= uVar19)) {
    uVar27 = local_38;
    if (7 < uVar7) {
      lVar17 = 0;
      uVar26 = 0;
LAB_001028bc:
      if (*(ulong *)(puVar1 + uVar26 * 8) == *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar11))
      goto code_r0x001028ca;
      uVar26 = *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar11) ^ *(ulong *)(puVar1 + uVar26 * 8)
      ;
      uVar27 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      uVar26 = (uVar27 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_001028f4;
    }
    uVar26 = 0;
    puVar12 = puVar1;
    goto joined_r0x00102960;
  }
  goto LAB_00102940;
code_r0x001028ca:
  uVar26 = uVar26 + 1;
  lVar17 = lVar17 + -8;
  if (local_70 == uVar26) goto code_r0x001028d8;
  goto LAB_001028bc;
code_r0x001028d8:
  uVar26 = -lVar17;
  puVar12 = puVar1 + -lVar17;
joined_r0x00102960:
  for (; (uVar27 != 0 && (ringbuffer[uVar26 + uVar11] == *puVar12)); uVar26 = uVar26 + 1) {
    uVar27 = uVar27 - 1;
    puVar12 = puVar12 + 1;
  }
LAB_001028f4:
  if (3 < uVar26) {
    iVar14 = 0x1f;
    if ((uint)uVar22 != 0) {
      for (; (uint)uVar22 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar27 = (ulong)(iVar14 * -0x1e + 0x780) + uVar26 * 0x87;
    if (uVar24 < uVar27) {
      uVar20 = puVar1[uVar26];
      uVar23 = uVar26;
      uVar24 = uVar27;
      local_f8 = uVar22;
      local_d0 = uVar26;
    }
  }
LAB_00102940:
  bVar28 = lVar16 != 0;
  lVar16 = lVar16 + 1;
  if (bVar28) goto LAB_0010297b;
  goto LAB_00102876;
LAB_0010297b:
  *(uint *)(lVar2 + *(long *)((long)auStack_a8 + (ulong)((uint)uVar15 & 8)) * 4) = (uint)uVar15;
  bVar28 = uVar13 + 0xaf <= uVar24;
  local_e0 = sVar21;
  iVar14 = iVar10;
  if (bVar28) {
    local_108 = local_108 + 1;
    local_100 = local_f8;
    uVar13 = uVar24;
    uVar25 = local_d0;
    local_e0 = uVar15;
    iVar14 = iVar10 + 1;
  }
  bVar3 = 2 < iVar10;
  uVar23 = sVar21 + 9;
  uVar18 = uVar18 - 1;
  sVar21 = local_e0;
  iVar10 = iVar14;
  if (!bVar28 || (bVar3 || local_80 <= uVar23)) goto LAB_00102ad0;
  goto LAB_00102708;
LAB_00102ad0:
  uVar7 = local_e0 + local_48;
  if (uVar8 <= uVar7) {
    uVar7 = uVar8;
  }
  if (local_100 <= uVar7) {
    uVar18 = (ulong)*(int *)&(hasher->common).extra;
    uVar9 = 0;
    bVar28 = false;
    if (local_100 != uVar18) {
      uVar23 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      if (local_100 == uVar23) {
        uVar9 = 1;
      }
      else {
        uVar18 = (local_100 + 3) - uVar18;
        if (uVar18 < 7) {
          bVar6 = (byte)((int)uVar18 << 2);
          uVar9 = 0x9750468;
        }
        else {
          uVar23 = (local_100 + 3) - uVar23;
          if (6 < uVar23) {
            if (local_100 != (long)(int)(hasher->common).dict_num_lookups) {
              bVar28 = local_100 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar9 = 3;
              goto LAB_00102c0f;
            }
            uVar9 = 2;
            goto LAB_00102c0d;
          }
          bVar6 = (byte)((int)uVar23 << 2);
          uVar9 = 0xfdb1ace;
        }
        uVar9 = uVar9 >> (bVar6 & 0x1f) & 0xf;
      }
LAB_00102c0d:
      bVar28 = false;
    }
LAB_00102c0f:
    if (!bVar28) {
      uVar18 = (ulong)uVar9;
      goto LAB_00102c1b;
    }
  }
  uVar18 = local_100 + 0xf;
LAB_00102c1b:
  if ((local_100 <= uVar7) && (uVar18 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_100;
  }
  *(int *)local_e8 = (int)local_108;
  iVar10 = (int)uVar25;
  *(int *)((long)local_e8 + 4) = iVar10;
  uVar7 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  if (uVar18 < uVar7) {
    *(short *)((long)local_e8 + 0xe) = (short)uVar18;
    iVar14 = 0;
  }
  else {
    bVar6 = (byte)*(int *)(literal_context_lut + 0x40);
    uVar18 = ((uVar18 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar6 & 0x3f))) - 0x10;
    uVar9 = 0x1f;
    if ((uint)uVar18 != 0) {
      for (; (uint)uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
    bVar28 = (uVar18 >> ((ulong)uVar9 & 0x3f) & 1) != 0;
    iVar14 = uVar9 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)local_e8 + 0xe) =
         (short)((uint)bVar28 + iVar14 * 2 + 0xfffe << (bVar6 & 0x3f)) +
         (short)uVar7 + (~(ushort)(-1 << (bVar6 & 0x1f)) & (ushort)uVar18) | (short)iVar14 * 0x400;
    iVar14 = (int)(uVar18 - ((ulong)bVar28 + 2 << ((byte)uVar9 & 0x3f)) >> (bVar6 & 0x3f));
  }
  *(int *)(local_e8 + 1) = iVar14;
  uVar7 = local_108;
  if (5 < local_108) {
    if (local_108 < 0x82) {
      uVar9 = 0x1f;
      uVar11 = (uint)(local_108 - 2);
      if (uVar11 != 0) {
        for (; uVar11 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar7 = (ulong)((int)(local_108 - 2 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                      (uVar9 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (local_108 < 0x842) {
      uVar11 = (int)local_108 - 0x42;
      uVar9 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar7 = (ulong)((uVar9 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar7 = 0x15;
      if (0x1841 < local_108) {
        uVar7 = (ulong)(ushort)(0x17 - (local_108 < 0x5842));
      }
    }
  }
  uVar18 = (ulong)iVar10;
  if (uVar18 < 10) {
    uVar9 = iVar10 - 2;
  }
  else if (uVar18 < 0x86) {
    uVar9 = 0x1f;
    uVar11 = (uint)(uVar18 - 6);
    if (uVar11 != 0) {
      for (; uVar11 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (int)(uVar18 - 6 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
            (uVar9 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar9 = 0x17;
    if (uVar18 < 0x846) {
      uVar9 = 0x1f;
      if (iVar10 - 0x46U != 0) {
        for (; iVar10 - 0x46U >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar9;
  uVar5 = (uVar4 & 7) + ((ushort)uVar7 & 7) * 8;
  if ((((*(ushort *)((long)local_e8 + 0xe) & 0x3ff) == 0) && ((ushort)uVar7 < 8)) && (uVar4 < 0x10))
  {
    if (7 < uVar4) {
      uVar5 = uVar5 | 0x40;
    }
  }
  else {
    iVar10 = (int)((uVar7 & 0xffff) >> 3) * 3 + ((uVar9 & 0xffff) >> 3);
    uVar5 = uVar5 + ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar10 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_e8 + 0xc) = uVar5;
  *num_commands = *num_commands + local_108;
  position = uVar25 + local_e0;
  uVar7 = local_40;
  if (position < local_40) {
    uVar7 = position;
  }
  uVar18 = local_e0 + 2;
  if (local_100 < uVar25 >> 2) {
    uVar23 = position + local_100 * -4;
    if (uVar23 < uVar18) {
      uVar23 = uVar18;
    }
    uVar18 = uVar23;
    if (uVar7 < uVar23) {
      uVar18 = uVar7;
    }
  }
  local_e0 = local_88 + uVar25 * 2 + local_e0;
  local_e8 = local_e8 + 2;
  if (uVar18 < uVar7) {
    do {
      *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar18 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar18 & 8) & 0xffff) * 4) = (uint)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar7 != uVar18);
  }
  local_108 = 0;
LAB_00102ebb:
  uVar7 = local_80;
  sVar21 = position;
  if (local_80 <= position + 8) goto LAB_00102f52;
  goto LAB_00102493;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}